

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

int __thiscall gvr::PLYReader::open(PLYReader *this,char *__file,int __oflag,...)

{
  ifstream *piVar1;
  string *propname;
  pointer *pppPVar2;
  char *pcVar3;
  pointer pPVar4;
  pointer pcVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  ply_type pVar12;
  ply_type t_value;
  pointer ppPVar13;
  IOException *pIVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long lVar16;
  PLYElement *pPVar17;
  pointer ppPVar18;
  iterator __position;
  pointer pPVar19;
  ulong uVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  format;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  PLYElement *element;
  ply_encoding local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>> *local_a8;
  PLYElement *local_a0;
  PLYProperty local_98;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar3 = (char *)(this->filename)._M_string_length;
  strlen(__file);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar3,(ulong)__file);
  ppPVar13 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppPVar18 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar18 != ppPVar13) {
    uVar20 = 0;
    do {
      pPVar17 = ppPVar13[uVar20];
      if (pPVar17 != (PLYElement *)0x0) {
        pPVar4 = (pPVar17->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar19 = (pPVar17->list).
                       super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar19 != pPVar4;
            pPVar19 = pPVar19 + 1) {
          anon_unknown_3::PLYProperty::~PLYProperty(pPVar19);
        }
        pPVar19 = (pPVar17->list).
                  super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pPVar19 != (pointer)0x0) {
          operator_delete(pPVar19);
        }
        pcVar5 = (pPVar17->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &(pPVar17->name).field_2) {
          operator_delete(pcVar5);
        }
        operator_delete(pPVar17);
      }
      uVar20 = uVar20 + 1;
      ppPVar13 = (this->list).
                 super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppPVar18 = (this->list).
                 super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (uVar20 < (ulong)((long)ppPVar18 - (long)ppPVar13 >> 3));
  }
  if (ppPVar18 != ppPVar13) {
    (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar13;
  }
  piVar1 = &this->in;
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 != '\0') {
    std::ifstream::close();
  }
  lVar16 = *(long *)(*(long *)piVar1 + -0x18);
  *(undefined4 *)(&this->field_0x3c + lVar16) = 7;
  std::ios::clear((int)piVar1 + (int)lVar16);
  std::ifstream::open((char *)piVar1,(_Ios_Openmode)__file);
  cVar7 = std::istream::get();
  cVar8 = std::istream::get();
  cVar9 = std::istream::get();
  if (cVar9 == 'y' && (cVar8 == 'l' && cVar7 == 'p')) {
    cVar6 = (char)piVar1;
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar6);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)piVar1,(string *)&local_e8,cVar10);
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar6);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)piVar1,(string *)&local_e8,cVar10);
    gutil::trim(&local_e8);
    gutil::split(&local_108,&local_e8,' ',true);
    if ((long)local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      iVar11 = std::__cxx11::string::compare
                         ((char *)local_108.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (iVar11 == 0) {
        iVar11 = std::__cxx11::string::compare
                           ((char *)(local_108.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2));
        if (iVar11 == 0) {
          iVar11 = std::__cxx11::string::compare
                             ((char *)(local_108.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
          if (iVar11 == 0) {
            local_10c = ply_ascii;
          }
          else {
            iVar11 = std::__cxx11::string::compare
                               ((char *)(local_108.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
            if (iVar11 == 0) {
              local_10c = ply_big_endian;
            }
            else {
              iVar11 = std::__cxx11::string::compare
                                 ((char *)(local_108.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
              local_10c = ply_little_endian;
              if (iVar11 != 0) {
                pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_98,"Unknown ply encoding: ",
                               local_108.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1);
                gutil::IOException::IOException(pIVar14,(string *)&local_98);
                __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
              }
            }
          }
          cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar6);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)piVar1,(string *)&local_e8,cVar10);
          gutil::trim(&local_e8);
          local_a8 = (vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>> *)&this->list;
          while( true ) {
            iVar11 = std::__cxx11::string::compare((char *)&local_e8);
            if (iVar11 == 0) break;
            iVar11 = std::__cxx11::string::compare((ulong)&local_e8,0,(char *)0x7);
            if (iVar11 == 0) {
              pPVar17 = PLYElement::fromString(&local_e8);
              __position._M_current =
                   (this->list).
                   super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              local_a0 = pPVar17;
              if (__position._M_current ==
                  (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>>::
                _M_realloc_insert<gvr::PLYElement*const&>(local_a8,__position,&local_a0);
              }
              else {
LAB_0011c9aa:
                *__position._M_current = pPVar17;
                pppPVar2 = &(this->list).
                            super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppPVar2 = *pppPVar2 + 1;
              }
            }
            else {
              iVar11 = std::__cxx11::string::compare((ulong)&local_e8,0,(char *)0x7);
              if (iVar11 == 0) {
                pPVar17 = PLYElement::fromString(&local_e8);
                __position._M_current =
                     (this->list).
                     super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_98._0_8_ = pPVar17;
                if (__position._M_current !=
                    (this->list).
                    super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0011c9aa;
                std::vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>>::
                _M_realloc_insert<gvr::PLYElement*>(local_a8,__position,(PLYElement **)&local_98);
              }
              else {
                iVar11 = std::__cxx11::string::compare((ulong)&local_e8,0,(char *)0x8);
                pPVar17 = local_a0;
                if (iVar11 == 0) {
                  if (local_a0 == (PLYElement *)0x0) {
                    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_98,"Property without an parent element: ",&local_e8);
                    gutil::IOException::IOException(pIVar14,(string *)&local_98);
                    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
                  }
                  local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  gutil::split(&local_c8,&local_e8,' ',true);
                  iVar11 = std::__cxx11::string::compare
                                     ((char *)local_c8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar11 != 0) {
                    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
                    std::operator+(&local_50,"Invalid PLY property definition: ",&local_e8);
                    gutil::IOException::IOException(pIVar14,&local_50);
                    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
                  }
                  lVar16 = (long)local_c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                  if (lVar16 == 5) {
                    iVar11 = std::__cxx11::string::compare
                                       ((char *)(local_c8.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 1));
                    if (iVar11 != 0) goto LAB_0011cb11;
                    local_58 = local_c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4;
                    pVar12 = anon_unknown_3::PLYProperty::name2Type
                                       (local_c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 2);
                    t_value = anon_unknown_3::PLYProperty::name2Type
                                        (local_c8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 3);
                    anon_unknown_3::PLYProperty::PLYProperty
                              (&local_98,local_58,pVar12,t_value,local_10c);
                  }
                  else {
                    if (lVar16 != 3) {
LAB_0011cb11:
                      pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
                      std::operator+(&local_50,"Invalid PLY property definition: ",&local_e8);
                      gutil::IOException::IOException(pIVar14,&local_50);
                      __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception
                                 );
                    }
                    propname = local_c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2;
                    pVar12 = anon_unknown_3::PLYProperty::name2Type
                                       (local_c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
                    anon_unknown_3::PLYProperty::PLYProperty(&local_98,propname,pVar12,local_10c);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_c8);
                  PLYElement::addProperty(pPVar17,&local_98);
                  if (local_98.value != (PLYValue *)0x0) {
                    (*(local_98.value)->_vptr_PLYValue[1])();
                  }
                  if (local_98.name._M_dataplus._M_p != (pointer)((long)&local_98 + 0x18U)) {
                    operator_delete(local_98.name._M_dataplus._M_p);
                  }
                }
              }
            }
            cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)piVar1,(string *)&local_e8,cVar10);
            gutil::trim(&local_e8);
          }
          goto LAB_0011c7b7;
        }
      }
    }
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   "Unknown ply format or version: ",&local_e8);
    gutil::IOException::IOException(pIVar14,(string *)&local_98);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  std::ifstream::close();
LAB_0011c7b7:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  paVar15 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar15) {
    operator_delete(local_e8._M_dataplus._M_p);
    paVar15 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)paVar15 >> 8),cVar9 == 'y' && (cVar8 == 'l' && cVar7 == 'p'));
}

Assistant:

bool PLYReader::open(const char *name)
{
  std::string         line;
  std::vector<std::string> format;
  ply_encoding   encoding;
  PLYElement     *element;

  filename=name;

  // empty list, close file (if necessary) and open new file

  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }

  list.clear();

  if (in.is_open())
  {
    in.close();
  }

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // check magic code

  char id[3];
  id[0]=static_cast<char>(in.get());
  id[1]=static_cast<char>(in.get());
  id[2]=static_cast<char>(in.get());

  if (id[0] != 'p' || id[1] != 'l' || id[2] != 'y')
  {
    in.close();
    return false;
  }

  // skip rest of the line

  getline(in, line);

  // read format

  getline(in, line);
  gutil::trim(line);

  gutil::split(format, line);

  if (format.size() != 3 || format[0].compare("format") != 0 ||
      format[2].compare("1.0") != 0)
  {
    throw gutil::IOException("Unknown ply format or version: "+line);
  }

  if (format[1].compare("ascii") == 0)
  {
    encoding=ply_ascii;
  }
  else if (format[1].compare("binary_big_endian") == 0)
  {
    encoding=ply_big_endian;
  }
  else if (format[1].compare("binary_little_endian") == 0)
  {
    encoding=ply_little_endian;
  }
  else
  {
    throw gutil::IOException("Unknown ply encoding: "+format[1]);
  }

  // read all elements and properties of header

  getline(in, line);
  gutil::trim(line);

  while (line.compare("end_header") != 0)
  {
    if (line.compare(0, 7, "element") == 0)
    {
      element=PLYElement::fromString(line);
      list.push_back(element);
    }
    else if (line.compare(0, 7, "comment") == 0)
    {
      list.push_back(PLYElement::fromString(line));
    }
    else if (line.compare(0, 8, "property") == 0)
    {
      if (element == 0)
      {
        throw gutil::IOException("Property without an parent element: "+line);
      }

      element->addProperty(PLYProperty::fromString(line, encoding));
    }

    getline(in, line);
    gutil::trim(line);
  }

  return true;
}